

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyShader
          (anon_unknown_0 *this,NegativeTestContext *ctx,ShaderType shaderType,string shaderSource)

{
  ostringstream *this_00;
  TestLog *log;
  undefined4 in_register_00000014;
  int local_21c;
  char *local_218;
  Shader local_210;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_130 [264];
  
  local_218 = (char *)CONCAT44(in_register_00000014,shaderType);
  log = *(TestLog **)(this + 8);
  glu::Shader::Shader(&local_210,*(RenderContext **)(this + 0x20),(ShaderType)ctx);
  glu::Shader::setSources(&local_210,1,&local_218,&local_21c);
  glu::Shader::compile(&local_210);
  glu::operator<<(log,&local_210);
  if (local_210.m_info.compileOk == true) {
    this_00 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Expected shader to fail, but compilation passed.",0x30);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Shader was not expected to compile.\n","");
    NegativeTestContext::fail((NegativeTestContext *)this,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
  }
  glu::Shader::~Shader(&local_210);
  return;
}

Assistant:

void verifyShader (NegativeTestContext& ctx, glu::ShaderType shaderType, std::string shaderSource)
{
	tcu::TestLog&	log		= ctx.getLog();
	const char*		source	= shaderSource.c_str();
	const int		length	= (int) shaderSource.size();
	glu::Shader		shader	(ctx.getRenderContext(), shaderType);

	shader.setSources(1, &source, &length);
	shader.compile();

	log << shader;
	if (shader.getCompileStatus())
	{
		log << tcu::TestLog::Message << "Expected shader to fail, but compilation passed." << tcu::TestLog::EndMessage;
		ctx.fail("Shader was not expected to compile.\n");
	}
}